

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  IRContext *pIVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint32_t uVar6;
  _Type member_idx;
  array<signed_char,_4UL> aVar7;
  Instruction *pIVar8;
  Operand *__args;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  OperandList new_operands;
  uint32_t local_ac;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ == OpCompositeInsert) {
LAB_0056ee97:
    OVar1 = inst->opcode_;
    uVar9 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar9 = (uint)inst->has_result_id_;
    }
    uVar6 = Instruction::GetSingleWordOperand(inst,(OVar1 == OpSpecConstantOp) + uVar9 + 1);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar8 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar6);
    uVar6 = 0;
    local_ac = 0;
    if (pIVar8->has_type_id_ == true) {
      local_ac = Instruction::GetSingleWordOperand(pIVar8,0);
    }
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      __args = Instruction::GetInOperand(inst,uVar6);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 __args);
      uVar6 = uVar6 + 1;
    } while ((OVar1 == OpSpecConstantOp | 2) != uVar6);
    uVar10 = OVar1 == OpSpecConstantOp | 2;
    uVar9 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar9 = (uint)inst->has_result_id_;
    }
    bVar3 = true;
    bVar11 = uVar10 < (int)((ulong)((long)(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar9;
    if (bVar11) {
      bVar5 = 0;
      bVar4 = 0;
      do {
        member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar9 + uVar10);
        aVar7._M_elems = (_Type)GetNewMemberIndex(this,local_ac,(uint32_t)member_idx);
        if (aVar7._M_elems == (_Type)0xffffffff) {
          IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
        }
        else {
          bVar4 = bVar5;
          if (member_idx != aVar7._M_elems) {
            bVar4 = 1;
          }
          local_a0._0_8_ = &PTR__SmallVector_00b15d78;
          local_a0._24_8_ = local_a0 + 0x10;
          local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._8_8_ = 1;
          local_78._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
          local_78._8_8_ = &PTR__SmallVector_00b15d78;
          local_78._16_8_ = 0;
          local_78._32_8_ = local_78 + 0x18;
          local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._16_4_ = aVar7._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_a0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
          local_78._8_8_ = &PTR__SmallVector_00b15d78;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_50,local_50._M_head_impl);
          }
          local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_a0._0_8_ = &PTR__SmallVector_00b15d78;
          if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_80,local_80._M_head_impl);
          }
          pIVar2 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar2);
          }
          pIVar8 = analysis::DefUseManager::GetDef
                             ((pIVar2->def_use_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                              .
                              super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                              ._M_head_impl,local_ac);
          OVar1 = pIVar8->opcode_;
          if ((int)OVar1 < 0x1168) {
            if (OpTypeStruct < OVar1) {
LAB_0056f226:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                            ,0x299,
                            "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                           );
            }
            if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) != 0) goto LAB_0056f0c1;
            if (OVar1 != OpTypeStruct) goto LAB_0056f226;
            uVar9 = (pIVar8->has_result_id_ & 1) + 1;
            if (pIVar8->has_type_id_ == false) {
              uVar9 = (uint)pIVar8->has_result_id_;
            }
            uVar6 = uVar9 + (int)aVar7._M_elems;
          }
          else {
            if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
               (OVar1 != OpTypeCooperativeMatrixNV)) goto LAB_0056f226;
LAB_0056f0c1:
            uVar6 = (pIVar8->has_result_id_ & 1) + 1;
            if (pIVar8->has_type_id_ == false) {
              uVar6 = (uint)pIVar8->has_result_id_;
            }
          }
          local_ac = Instruction::GetSingleWordOperand(pIVar8,uVar6);
          bVar5 = bVar4;
        }
        if (aVar7._M_elems == (_Type)0xffffffff) break;
        uVar10 = uVar10 + 1;
        uVar9 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar9 = (uint)inst->has_result_id_;
        }
        bVar11 = uVar10 < (int)((ulong)((long)(inst->operands_).
                                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(inst->operands_).
                                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555 - uVar9;
      } while (bVar11);
      bVar3 = (bool)(bVar4 ^ 1);
    }
    if ((bVar11 == false) && (!bVar3)) {
      uVar9 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar9 = (uint)inst->has_result_id_;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&inst->operands_,
                 (Operand *)
                 ((long)((((inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                        0xfffffffffffffffa) + (ulong)(uVar9 * 0x30)),
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pIVar2 = (this->super_MemPass).super_Pass.context_;
      bVar11 = true;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar2->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48)
    ;
    return bVar11;
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar6 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar6 = (uint)inst->has_result_id_;
    }
    uVar6 = Instruction::GetSingleWordOperand(inst,uVar6);
    if (uVar6 == 0x52) goto LAB_0056ee97;
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeInsert)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x269,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
               );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompositeInsert(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeInsert));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }

  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand + 1);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;

  for (uint32_t i = 0; i < first_operand + 2; ++i) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 2; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    if (new_member_idx == kRemovedMember) {
      context()->KillInst(inst);
      return true;
    }

    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}